

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O2

void __thiscall
rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>
          (RPNExpression *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  _Head_base<0UL,_rpn::IExpression_*,_false> local_20;
  _Alloc_hider local_18;
  
  std::make_unique<rpn::StringExpression,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  local_20._M_head_impl = (IExpression *)local_18._M_p;
  local_18._M_p = (pointer)0x0;
  std::
  vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
  ::emplace_back<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>
            ((vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
              *)this,(unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *)
                     &local_20);
  if (local_20._M_head_impl != (IExpression *)0x0) {
    (*(local_20._M_head_impl)->_vptr_IExpression[1])();
  }
  local_20._M_head_impl = (IExpression *)0x0;
  if ((long *)local_18._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_18._M_p + 8))();
  }
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }